

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_2d__format__hint
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *text_00;
  bool bVar1;
  bool bVar2;
  int *piVar3;
  StringHash SVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  xmlChar **ppxVar8;
  bool failed_2;
  bool failed_1;
  bool failed;
  bool local_43;
  bool local_42;
  bool local_41;
  uint *local_40;
  uint *local_38;
  
  piVar3 = (int *)GeneratedSaxParser::StackMemoryManager::newObject
                            (&(this->
                              super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                              ).super_ParserTemplateBase.mStackMemoryManager,0x18);
  piVar3[0] = 7;
  piVar3[1] = 6;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  *attributeDataPtr = piVar3;
  ppxVar8 = attributes->attributes;
  if (ppxVar8 != (xmlChar **)0x0) {
    local_38 = &DAT_0085b2f8;
    local_40 = &DAT_0085b348;
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        text_00 = ppxVar8[1];
        ppxVar8 = ppxVar8 + 2;
        if ((long)SVar4 < 0xba0e9de) {
          if (SVar4 == 0x7884d5) {
            SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_42);
            bVar2 = false;
            uVar7 = 0;
            puVar6 = local_38;
            do {
              if (*(StringHash *)(puVar6 + -2) == SVar4) {
                local_42 = false;
                validationDataPtr = (void **)(ulong)*puVar6;
              }
              iVar5 = (int)validationDataPtr;
              if (*(StringHash *)(puVar6 + -2) == SVar4) break;
              bVar2 = 3 < uVar7;
              uVar7 = uVar7 + 1;
              puVar6 = puVar6 + 4;
            } while (uVar7 != 5);
            if (bVar2) {
              local_42 = true;
              iVar5 = 5;
            }
            piVar3[1] = iVar5;
            if (local_42 == true) {
              SVar4 = 0x7884d5;
              goto LAB_0074689c;
            }
            goto LAB_007468b9;
          }
          if (SVar4 == 0x7a6795) {
            *(ParserChar **)(piVar3 + 4) = text_00;
          }
          else {
LAB_00746794:
            bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_UNKNOWN_ATTRIBUTE,0x6f054,text,text_00);
            validationDataPtr = (void **)0x1;
            if (bVar2) goto LAB_007468c8;
          }
        }
        else {
          if (SVar4 == 0xba0e9de) {
            SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_43);
            bVar2 = false;
            uVar7 = 0;
            puVar6 = local_40;
            do {
              if (*(StringHash *)(puVar6 + -2) == SVar4) {
                local_43 = false;
                validationDataPtr = (void **)(ulong)*puVar6;
              }
              iVar5 = (int)validationDataPtr;
              if (*(StringHash *)(puVar6 + -2) == SVar4) break;
              bVar2 = 3 < uVar7;
              uVar7 = uVar7 + 1;
              puVar6 = puVar6 + 4;
            } while (uVar7 != 5);
            if (bVar2) {
              local_43 = true;
              iVar5 = 5;
            }
            piVar3[2] = iVar5;
            if (local_43 != true) goto LAB_007468b9;
            SVar4 = 0xba0e9de;
LAB_0074689c:
            bVar2 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x6f054,SVar4,text_00);
            if (!bVar1) goto LAB_007468b9;
            validationDataPtr = (void **)0x1;
          }
          else {
            if (SVar4 != 0xe854ea3) goto LAB_00746794;
            SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_41);
            bVar2 = false;
            uVar7 = 0;
            puVar6 = &DAT_0085b298;
            do {
              if (*(StringHash *)(puVar6 + -2) == SVar4) {
                local_41 = false;
                validationDataPtr = (void **)(ulong)*puVar6;
              }
              iVar5 = (int)validationDataPtr;
              if (*(StringHash *)(puVar6 + -2) == SVar4) break;
              bVar2 = 4 < uVar7;
              uVar7 = uVar7 + 1;
              puVar6 = puVar6 + 4;
            } while (uVar7 != 6);
            if (bVar2) {
              local_41 = true;
              iVar5 = 6;
            }
            *piVar3 = iVar5;
            if (local_41 == true) {
              SVar4 = 0xe854ea3;
              goto LAB_0074689c;
            }
LAB_007468b9:
            validationDataPtr = (void **)0x4;
            bVar2 = true;
          }
          if (!bVar2) goto LAB_007468c8;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_007468c8:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*piVar3 == 7) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x6f054,0xe854ea3,(ParserChar *)0x0),
     bVar2)) {
    return false;
  }
  if ((piVar3[1] == 6) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x6f054,0x7884d5,(ParserChar *)0x0), bVar2
     )) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_2d__format__hint( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_2d__format__hint( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_2d__format__hint__AttributeData* attributeData = newData<create_2d__format__hint__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CHANNELS:
    {
bool failed;
attributeData->channels = Utils::toEnum<ENUM__image_format_hint_channels_enum, StringHash, ENUM__image_format_hint_channels_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_channels_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_CHANNELS,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_RANGE:
    {
bool failed;
attributeData->range = Utils::toEnum<ENUM__image_format_hint_range_enum, StringHash, ENUM__image_format_hint_range_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_range_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_RANGE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PRECISION:
    {
bool failed;
attributeData->precision = Utils::toEnum<ENUM__image_format_hint_precision_enum, StringHash, ENUM__image_format_hint_precision_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_precision_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_PRECISION,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_SPACE:
    {

attributeData->space = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_HINT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->channels == ENUM__image_format_hint_channels_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_CHANNELS, 0 ) )
        return false;
}
if ( attributeData->range == ENUM__image_format_hint_range_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_RANGE, 0 ) )
        return false;
}


    return true;
}